

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O3

void Gia_ManCollectTfi(Gia_Man_t *p,Vec_Int_t *vRoots,Vec_Int_t *vNodes)

{
  long lVar1;
  
  vNodes->nSize = 0;
  Gia_ManIncrementTravId(p);
  if (0 < vRoots->nSize) {
    lVar1 = 0;
    do {
      Gia_ManCollectTfi_rec(p,vRoots->pArray[lVar1],vNodes);
      lVar1 = lVar1 + 1;
    } while (lVar1 < vRoots->nSize);
  }
  return;
}

Assistant:

void Gia_ManCollectTfi( Gia_Man_t * p, Vec_Int_t * vRoots, Vec_Int_t * vNodes )
{
    int i, iRoot; 
    Vec_IntClear( vNodes );
    Gia_ManIncrementTravId( p );
    Vec_IntForEachEntry( vRoots, iRoot, i )
        Gia_ManCollectTfi_rec( p, iRoot, vNodes );
}